

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper_ssl.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
license::CryptoHelperLinux::exportPublicKey
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          CryptoHelperLinux *this)

{
  RSA *b;
  logic_error *this_00;
  BIO_METHOD *type;
  long lVar1;
  size_type __n;
  reference data;
  allocator<unsigned_char> local_67;
  value_type_conflict1 local_66 [2];
  int local_64;
  rsa_st *prStack_60;
  int keylen;
  RSA *rsa;
  BIO *bio_public;
  allocator local_39;
  string local_38 [32];
  CryptoHelperLinux *local_18;
  CryptoHelperLinux *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  
  local_18 = this;
  this_local = (CryptoHelperLinux *)__return_storage_ptr__;
  if (this->m_pktmp != (EVP_PKEY *)0x0) {
    type = BIO_s_mem();
    rsa = (RSA *)BIO_new(type);
    prStack_60 = EVP_PKEY_get1_RSA((EVP_PKEY *)this->m_pktmp);
    i2d_RSAPublicKey_bio((BIO *)rsa,prStack_60);
    lVar1 = BIO_ctrl((BIO *)rsa,10,0,(void *)0x0);
    local_64 = (int)lVar1;
    local_66[1] = 0;
    __n = (size_type)local_64;
    local_66[0] = '\0';
    std::allocator<unsigned_char>::allocator(&local_67);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,__n,local_66,&local_67);
    std::allocator<unsigned_char>::~allocator(&local_67);
    b = rsa;
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,0);
    BIO_read((BIO *)b,data,local_64);
    BIO_free_all((BIO *)rsa);
    return __return_storage_ptr__;
  }
  bio_public._3_1_ = 1;
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"Export not initialized.Call generateKeyPair first.",&local_39);
  std::logic_error::logic_error(this_00,local_38);
  bio_public._3_1_ = 0;
  __cxa_throw(this_00,std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const vector<unsigned char> CryptoHelperLinux::exportPublicKey() const {
	if (m_pktmp == NULL) {
		throw logic_error(string("Export not initialized.Call generateKeyPair first."));
	}
	BIO *bio_public = BIO_new(BIO_s_mem());
	RSA *rsa = EVP_PKEY_get1_RSA(m_pktmp);
	// PEM_write_bio_RSAPublicKey(bio_public, rsa);
	i2d_RSAPublicKey_bio(bio_public, rsa);
	int keylen = BIO_pending(bio_public);
	vector<unsigned char> buffer(keylen, 0);
	// char *pem_key = (char*) (calloc(keylen + 1, 1));
	BIO_read(bio_public, &buffer[0], keylen);
	BIO_free_all(bio_public);
	return buffer;
}